

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,CallOrCast *call)

{
  pool_ref<soul::AST::Expression> *e;
  CommaSeparatedList *pCVar1;
  Allocator *pAVar2;
  IdentifierPath *other;
  Scope *this_00;
  bool bVar3;
  size_t sVar4;
  int iVar5;
  TypeCast *pTVar6;
  TypeCast *pTVar7;
  ProcessorBase *p_00;
  bool bVar8;
  Expression *pEVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  NameSearch search;
  pool_ptr<soul::AST::ProcessorBase> p;
  NameSearch local_160;
  Type local_a0;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_88;
  
  pCVar1 = (call->super_CallOrCastBase).arguments.object;
  if (pCVar1 != (CommaSeparatedList *)0x0) {
    RewritingASTVisitor::visitObject((RewritingASTVisitor *)this,&pCVar1->super_Expression);
    pCVar1 = (call->super_CallOrCastBase).arguments.object;
    if ((pCVar1 != (CommaSeparatedList *)0x0) &&
       (iVar5 = (*(pCVar1->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(),
       (char)iVar5 == '\0')) {
      return (Expression *)call;
    }
  }
  e = &call->nameOrType;
  pEVar9 = (call->nameOrType).object;
  if (pEVar9->kind == type) {
    iVar5 = (*(pEVar9->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    if ((char)iVar5 != '\0') {
      pAVar2 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.allocator
      ;
      (*(((call->nameOrType).object)->super_Statement).super_ASTObject._vptr_ASTObject[5])
                (&local_a0);
      pTVar6 = convertToCast(pAVar2,call,&local_a0);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_a0.structure.object);
      return &pTVar6->super_Expression;
    }
    pEVar9 = e->object;
  }
  if ((((pEVar9 == (Expression *)0x0) ||
       (pTVar6 = (TypeCast *)
                 __dynamic_cast(pEVar9,&AST::Expression::typeinfo,
                                &AST::QualifiedIdentifier::typeinfo,0), pTVar6 == (TypeCast *)0x0))
      || (other = *(IdentifierPath **)&pTVar6->targetType,
         *(long *)&(pTVar6->targetType).boundingSize - (long)other != 0x60)) ||
     (other[1].pathSections.items != (Identifier *)0x0)) {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
    return (Expression *)call;
  }
  IdentifierPath::operator+((IdentifierPath *)&local_160,(IdentifierPath *)&pTVar6->source,other);
  sVar4 = local_160.itemsFound.numActive;
  local_160.itemsFound.numActive = 0;
  if ((8 < local_160.itemsFound.numAllocated) &&
     (local_160.itemsFound.items != (pool_ref<soul::AST::ASTObject> *)0x0)) {
    operator_delete__(local_160.itemsFound.items);
  }
  if (1 < sVar4) {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
  }
  bVar10 = this->parsingProcessorInstance != 0;
  bVar11 = (this->currentConnectionEndpoint).object != (SharedEndpoint *)0x0;
  local_160.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_160.itemsFound.space;
  local_160.itemsFound.numActive = 0;
  local_160.itemsFound.numAllocated = 8;
  local_160.partiallyQualifiedPath.pathSections.items =
       (Identifier *)local_160.partiallyQualifiedPath.pathSections.space;
  local_160.partiallyQualifiedPath.pathSections.numActive = 0;
  local_160.partiallyQualifiedPath.pathSections.numAllocated = 8;
  local_160.stopAtFirstScopeWithResults = false;
  local_160.requiredNumFunctionArgs = -1;
  local_160.findVariables = true;
  local_160.findTypes = true;
  local_160.findFunctions = true;
  local_160.findNamespaces = true;
  local_160.findProcessors = true;
  local_160.findProcessorInstances = false;
  local_160.findEndpoints = true;
  local_160.onlyFindLocalVariables = false;
  IdentifierPath::operator+
            ((IdentifierPath *)&local_88,(IdentifierPath *)&pTVar6->source,
             *(IdentifierPath **)&pTVar6->targetType);
  bVar8 = bVar10 || bVar11;
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&local_160.partiallyQualifiedPath.pathSections,&local_88);
  local_88.numActive = 0;
  if (((Structure *)0x8 < local_88.numAllocated) &&
     ((ProcessorBase *)local_88.items != (ProcessorBase *)0x0)) {
    operator_delete__(local_88.items);
  }
  local_160.stopAtFirstScopeWithResults = true;
  local_160._184_2_ = 0x100;
  local_160.findFunctions = false;
  local_160.findNamespaces = bVar8;
  local_160.findProcessorInstances = false;
  local_160.findEndpoints = false;
  this_00 = (pTVar6->super_Expression).super_Statement.super_ASTObject.context.parentScope;
  local_160.findProcessors = bVar8;
  if (this_00 != (Scope *)0x0) {
    AST::Scope::performFullNameSearch(this_00,&local_160,(this->currentStatement).object);
  }
  bVar3 = true;
  bVar8 = bVar3;
  if (local_160.itemsFound.numActive != 1) goto LAB_001e8e48;
  if (*(uint64_t *)local_160.itemsFound.items == 0) {
    bVar12 = false;
LAB_001e8dad:
    bVar8 = (bool)(bVar12 ^ 1);
    if ((bVar12) || (!bVar10 && !bVar11)) goto LAB_001e8e48;
    if (local_160.itemsFound.numActive == 0) {
      throwInternalCompilerError("! empty()","front",0xa7);
    }
    bVar8 = bVar3;
    if ((*(uint64_t *)local_160.itemsFound.items == 0) ||
       (p_00 = (ProcessorBase *)
               __dynamic_cast(*(uint64_t *)local_160.itemsFound.items,&AST::ASTObject::typeinfo,
                              &AST::ProcessorBase::typeinfo,0), p_00 == (ProcessorBase *)0x0))
    goto LAB_001e8e48;
    pTVar6 = (TypeCast *)resolveProcessorInstance(this,call,p_00);
  }
  else {
    bVar12 = false;
    pTVar7 = (TypeCast *)
             __dynamic_cast(*(uint64_t *)local_160.itemsFound.items,&AST::ASTObject::typeinfo,
                            &AST::Expression::typeinfo,0);
    if (pTVar7 == (TypeCast *)0x0) goto LAB_001e8dad;
    if (((pTVar7->super_Expression).kind != type) ||
       (iVar5 = (*(pTVar7->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])
                          (pTVar7), (char)iVar5 == '\0')) {
      pTVar6 = pTVar7;
      if (!bVar10 && !bVar11) goto LAB_001e8e48;
      (*(pTVar7->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[6])
                (&local_88,pTVar7);
      bVar12 = (ProcessorBase *)local_88.items != (ProcessorBase *)0x0;
      if (bVar12) {
        pTVar6 = (TypeCast *)resolveProcessorInstance(this,call,(ProcessorBase *)local_88.items);
      }
      goto LAB_001e8dad;
    }
    pAVar2 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.allocator;
    (*(pTVar7->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[5])
              (&local_88,pTVar7);
    pCVar1 = (call->super_CallOrCastBase).arguments.object;
    if (pCVar1 == (CommaSeparatedList *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    pTVar6 = PoolAllocator::
             allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type,soul::AST::CommaSeparatedList&>
                       (&pAVar2->pool,
                        &(call->super_CallOrCastBase).super_Expression.super_Statement.
                         super_ASTObject.context,(Type *)&local_88,pCVar1);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_88.numAllocated);
  }
  bVar8 = false;
LAB_001e8e48:
  local_160.partiallyQualifiedPath.pathSections.numActive = 0;
  if (8 < local_160.partiallyQualifiedPath.pathSections.numAllocated) {
    if (local_160.partiallyQualifiedPath.pathSections.items != (Identifier *)0x0) {
      operator_delete__(local_160.partiallyQualifiedPath.pathSections.items);
    }
    local_160.partiallyQualifiedPath.pathSections.items =
         (Identifier *)local_160.partiallyQualifiedPath.pathSections.space;
    local_160.partiallyQualifiedPath.pathSections.numAllocated = 8;
  }
  local_160.itemsFound.numActive = 0;
  if ((8 < local_160.itemsFound.numAllocated) &&
     (local_160.itemsFound.items != (pool_ref<soul::AST::ASTObject> *)0x0)) {
    operator_delete__(local_160.itemsFound.items);
  }
  if (bVar8) {
    return (Expression *)call;
  }
  return &pTVar6->super_Expression;
}

Assistant:

AST::Expression& visit (AST::CallOrCast& call) override
        {
            if (call.arguments != nullptr)
                visitObject (*call.arguments);

            if (call.areAllArgumentsResolved())
            {
                if (AST::isResolvedAsType (call.nameOrType.get()))
                    return convertToCast (allocator, call, call.nameOrType->resolveAsType());

                if (auto name = cast<AST::QualifiedIdentifier> (call.nameOrType))
                {
                    if (! name->isSimplePath())
                    {
                        replaceExpression (call.nameOrType);
                        return call;
                    }

                    if (name->getPath().isQualified())
                        replaceExpression (call.nameOrType);

                    bool canResolveProcessorInstance = (parsingProcessorInstance != 0 || currentConnectionEndpoint != nullptr);

                    AST::Scope::NameSearch search;
                    search.partiallyQualifiedPath = name->getPath();
                    search.stopAtFirstScopeWithResults = true;
                    search.findVariables = false;
                    search.findTypes = true;
                    search.findFunctions = false;
                    search.findNamespaces = canResolveProcessorInstance;
                    search.findProcessors = canResolveProcessorInstance;
                    search.findProcessorInstances = false;
                    search.findEndpoints = false;

                    if (auto scope = name->getParentScope())
                        scope->performFullNameSearch (search, currentStatement.get());

                    if (search.itemsFound.size() == 1)
                    {
                        if (auto e = cast<AST::Expression> (search.itemsFound.front()))
                        {
                            if (AST::isResolvedAsType (e))
                                return allocator.allocate<AST::TypeCast> (call.context, e->resolveAsType(), *call.arguments);

                            if (canResolveProcessorInstance)
                                if (auto p = e->getAsProcessor())
                                    return resolveProcessorInstance (call, *p);
                        }

                        if (canResolveProcessorInstance)
                            if (auto p = cast<AST::ProcessorBase> (search.itemsFound.front()))
                                return resolveProcessorInstance (call, *p);
                    }
                }
                else
                {
                    replaceExpression (call.nameOrType);
                }
            }

            return call;
        }